

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

string * __thiscall
Diligent::FormatString<char[33],char[23],unsigned_long,char[26],unsigned_long,char[21]>
          (string *__return_storage_ptr__,Diligent *this,char (*Args) [33],char (*Args_1) [23],
          unsigned_long *Args_2,char (*Args_3) [26],unsigned_long *Args_4,char (*Args_5) [21])

{
  stringstream local_1c0 [8];
  stringstream ss;
  unsigned_long *Args_local_4;
  char (*Args_local_3) [26];
  unsigned_long *Args_local_2;
  char (*Args_local_1) [23];
  char (*Args_local) [33];
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  FormatStrSS<std::__cxx11::stringstream,char[33],char[23],unsigned_long,char[26],unsigned_long,char[21]>
            ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0,
             (char (*) [33])this,(char (*) [23])Args,(unsigned_long *)Args_1,(char (*) [26])Args_2,
             (unsigned_long *)Args_3,(char (*) [21])Args_4);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

std::string FormatString(const RestArgsType&... Args)
{
    std::stringstream ss;
    FormatStrSS(ss, Args...);
    return ss.str();
}